

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O2

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetEyeTrackerGlobalPosition
          (VClient *this,uint i_EyeTrackerID,double (*o_rThreeVector) [3],bool *o_rbOccludedFlag)

{
  pointer pVVar1;
  pointer pVVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  Enum EVar6;
  UInt32 *pUVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  Enum GetResult;
  scoped_lock Lock;
  array<double,_3UL> WorldTranslation;
  array<double,_3UL> local_c0;
  array<double,_3UL> WorldEyeTranslation;
  array<double,_3UL> EyeTranslation;
  array<double,_9UL> WorldRotation;
  
  boost::unique_lock<boost::recursive_mutex>::unique_lock(&Lock,&this->m_FrameMutex);
  GetResult = Success;
  bVar3 = InitGet<double[3],bool>(this,&GetResult,o_rThreeVector,o_rbOccludedFlag);
  EVar6 = GetResult;
  if (bVar3) {
    pVVar1 = (this->m_LatestFrame).m_EyeTrackers.
             super__Vector_base<ViconCGStream::VEyeTrackerInfo,_std::allocator<ViconCGStream::VEyeTrackerInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pUVar7 = &pVVar1->m_DeviceID;
    lVar5 = -1;
    for (lVar8 = 0;
        ((long)(this->m_LatestFrame).m_EyeTrackers.
               super__Vector_base<ViconCGStream::VEyeTrackerInfo,_std::allocator<ViconCGStream::VEyeTrackerInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) / 0x48 != lVar8;
        lVar8 = lVar8 + 1) {
      if (*pUVar7 == i_EyeTrackerID) {
        lVar5 = lVar8;
      }
      pUVar7 = pUVar7 + 0x12;
    }
    if (lVar5 == -1) {
      EVar6 = InvalidIndex;
    }
    else {
      pVVar2 = (this->m_LatestFrame).m_GlobalSegments.
               super__Vector_base<ViconCGStream::VGlobalSegments,_std::allocator<ViconCGStream::VGlobalSegments>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (uVar9 = 0; uVar10 = (ulong)uVar9,
          uVar10 < (ulong)(((long)(this->m_LatestFrame).m_GlobalSegments.
                                  super__Vector_base<ViconCGStream::VGlobalSegments,_std::allocator<ViconCGStream::VGlobalSegments>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2) / 0x28)
          ; uVar9 = uVar9 + 1) {
        if (pVVar2[uVar10].m_SubjectID == pVVar1[lVar5].m_SubjectID) {
          lVar8 = *(long *)&pVVar2[uVar10].m_Segments.
                            super__Vector_base<ViconCGStreamDetail::VGlobalSegments_Segment,_std::allocator<ViconCGStreamDetail::VGlobalSegments_Segment>_>
                            ._M_impl.super__Vector_impl_data;
          uVar4 = 0;
          while ((ulong)uVar4 <
                 (ulong)(((long)*(pointer *)
                                 ((long)&pVVar2[uVar10].m_Segments.
                                         super__Vector_base<ViconCGStreamDetail::VGlobalSegments_Segment,_std::allocator<ViconCGStreamDetail::VGlobalSegments_Segment>_>
                                         ._M_impl + 8) - lVar8) / 0x68)) {
            lVar11 = (ulong)uVar4 * 0x68;
            uVar4 = uVar4 + 1;
            if (*(UInt32 *)(lVar8 + lVar11) == pVVar1[lVar5].m_SegmentID) {
              lVar8 = lVar8 + lVar11;
              memmove(&WorldRotation,(void *)(lVar8 + 0x20),0x48);
              WorldTranslation._M_elems[0] = *(double *)(lVar8 + 8);
              WorldTranslation._M_elems[1] = *(double *)(lVar8 + 0x10);
              WorldTranslation._M_elems[2] = *(double *)(lVar8 + 0x18);
              std::__copy_move<false,false,std::random_access_iterator_tag>::
              __copy_m<float_const*,double*>
                        (pVVar1[lVar5].m_LocalTranslation,pVVar1[lVar5].m_LocalRotation,
                         EyeTranslation._M_elems);
              ClientUtils::operator*(&local_c0,&WorldRotation,&EyeTranslation);
              ClientUtils::operator+(&local_c0,&WorldTranslation);
              CopyAndTransformT(this,WorldEyeTranslation._M_elems,o_rThreeVector);
              goto LAB_00122f49;
            }
          }
        }
      }
      *o_rbOccludedFlag = true;
LAB_00122f49:
      EVar6 = Success;
    }
  }
  boost::unique_lock<boost::recursive_mutex>::~unique_lock(&Lock);
  return EVar6;
}

Assistant:

Result::Enum VClient::GetEyeTrackerGlobalPosition( const unsigned int i_EyeTrackerID, double (&o_rThreeVector)[3], bool& o_rbOccludedFlag ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  
  Result::Enum GetResult = Result::Success;
  if ( !InitGet( GetResult, o_rThreeVector, o_rbOccludedFlag ) )
  {
    return GetResult; 
  }

  size_t EyeTrackerIndex = -1;

  for( size_t i = 0; i < m_LatestFrame.m_EyeTrackers.size(); i++ )
  {
    if( m_LatestFrame.m_EyeTrackers[ i ].m_DeviceID == i_EyeTrackerID )
    {
      EyeTrackerIndex = i;
    }
  }

  if( EyeTrackerIndex == BadIndex )
  {
    return Result::InvalidIndex;
  }

  const ViconCGStream::VEyeTrackerInfo & rEyeTracker = m_LatestFrame.m_EyeTrackers[ EyeTrackerIndex ];

  // Look up the ids for the subject and segment
  unsigned int SubjectID = rEyeTracker.m_SubjectID;
  unsigned int SegmentID = rEyeTracker.m_SegmentID;

  // go through the frame's segment data and find its position in this frame
  for( unsigned int i = 0; i < m_LatestFrame.m_GlobalSegments.size(); i++ )
  {
    const ViconCGStream::VGlobalSegments& rSegments = m_LatestFrame.m_GlobalSegments[i];
    if( rSegments.m_SubjectID == SubjectID )
    {
      // now look through its segments
      for( unsigned int j = 0; j < rSegments.m_Segments.size(); j++ )
      {
        const ViconCGStreamDetail::VGlobalSegments_Segment& rSegment = rSegments.m_Segments[j];
        if( rSegment.m_SegmentID == SegmentID )
        {
          // Use the segment to calculate global eye location.

          std::array< double, 3 * 3 > WorldRotation;
          std::copy( rSegment.m_Rotation, rSegment.m_Rotation + 9, WorldRotation.begin() );

          std::array< double, 3 > WorldTranslation;
          std::copy( rSegment.m_Translation, rSegment.m_Translation + 3, WorldTranslation.begin() );

          std::array< double, 3 > EyeTranslation;
          std::copy( rEyeTracker.m_LocalTranslation, rEyeTracker.m_LocalTranslation + 3, EyeTranslation.begin() );

          const std::array< double, 3 > WorldEyeTranslation = WorldRotation * EyeTranslation + WorldTranslation;

          CopyAndTransformT( WorldEyeTranslation.data(), o_rThreeVector );
          return Result::Success;
        }       
      }
    }
  }

  // If we fail to find the segment it is probably just failed to fit.
  // We mark this as an occluded success.

  o_rbOccludedFlag = true;
  return Result::Success;
}